

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mesh.c
# Opt level: O1

bbox * get_quad_bbox(void *primitive_data,size_t index)

{
  undefined8 uVar1;
  bbox *in_RDI;
  float fVar2;
  float fVar3;
  float fVar5;
  ulong uVar4;
  float fVar6;
  float fVar7;
  float fVar8;
  float fVar9;
  float fVar10;
  float fVar11;
  float fVar12;
  float fVar13;
  float fVar14;
  float fVar15;
  float fVar16;
  
  uVar4 = *(ulong *)((long)primitive_data + index * 0x48);
  fVar2 = *(float *)((long)primitive_data + index * 0x48 + 8);
  uVar1 = *(undefined8 *)((long)primitive_data + index * 0x48 + 0xc);
  fVar3 = (float)uVar4;
  fVar5 = (float)(uVar4 >> 0x20);
  fVar6 = fVar3 - (float)uVar1;
  fVar7 = fVar5 - (float)((ulong)uVar1 >> 0x20);
  fVar8 = fVar2 - *(float *)((long)primitive_data + index * 0x48 + 0x14);
  uVar1 = *(undefined8 *)((long)primitive_data + index * 0x48 + 0x18);
  fVar9 = (float)uVar1 + fVar3;
  fVar10 = (float)((ulong)uVar1 >> 0x20) + fVar5;
  fVar12 = *(float *)((long)primitive_data + index * 0x48 + 0x20) + fVar2;
  uVar1 = *(undefined8 *)((long)primitive_data + index * 0x48 + 0x24);
  fVar13 = (float)uVar1 + fVar3;
  fVar14 = (float)((ulong)uVar1 >> 0x20) + fVar5;
  fVar11 = fVar9;
  if (fVar13 <= fVar9) {
    fVar11 = fVar13;
  }
  if (fVar9 <= fVar13) {
    fVar9 = fVar13;
  }
  fVar15 = *(float *)((long)primitive_data + index * 0x48 + 0x2c) + fVar2;
  fVar13 = fVar10;
  if (fVar14 <= fVar10) {
    fVar13 = fVar14;
  }
  fVar16 = fVar12;
  if (fVar15 <= fVar12) {
    fVar16 = fVar15;
  }
  if (fVar10 <= fVar14) {
    fVar10 = fVar14;
  }
  if (fVar12 <= fVar15) {
    fVar12 = fVar15;
  }
  fVar14 = fVar6;
  if (fVar11 <= fVar6) {
    fVar14 = fVar11;
  }
  fVar11 = fVar7;
  if (fVar13 <= fVar7) {
    fVar11 = fVar13;
  }
  fVar13 = fVar8;
  if (fVar16 <= fVar8) {
    fVar13 = fVar16;
  }
  if (fVar6 <= fVar9) {
    fVar6 = fVar9;
  }
  if (fVar7 <= fVar10) {
    fVar7 = fVar10;
  }
  if (fVar8 <= fVar12) {
    fVar8 = fVar12;
  }
  fVar10 = fVar3;
  if (fVar14 <= fVar3) {
    fVar10 = fVar14;
  }
  fVar12 = fVar5;
  if (fVar11 <= fVar5) {
    fVar12 = fVar11;
  }
  fVar11 = fVar2;
  if (fVar13 <= fVar2) {
    fVar11 = fVar13;
  }
  *(ulong *)(in_RDI->min)._ = CONCAT44(fVar12,fVar10);
  (in_RDI->min)._[2] = fVar11;
  if (fVar3 <= fVar6) {
    uVar4 = (ulong)(uint)fVar6;
  }
  if (fVar5 <= fVar7) {
    fVar5 = fVar7;
  }
  if (fVar2 <= fVar8) {
    fVar2 = fVar8;
  }
  *(ulong *)(in_RDI->max)._ = CONCAT44(fVar5,(int)uVar4);
  (in_RDI->max)._[2] = fVar2;
  return in_RDI;
}

Assistant:

static struct bbox get_quad_bbox(void* primitive_data, size_t index) {
    const struct quad* quad = &((const struct quad*)primitive_data)[index];
    return
        union_bbox(point_bbox(quad->p0),
        union_bbox(point_bbox(get_quad_p1(quad)),
        union_bbox(point_bbox(get_quad_p2(quad)),
            point_bbox(get_quad_p3(quad)))));
}